

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT_internal.c
# Opt level: O0

int32_t FACT_INTERNAL_DefaultReadFile
                  (void *hFile,void *buffer,uint32_t nNumberOfBytesToRead,
                  uint32_t *lpNumberOfBytesRead,FACTOverlapped *lpOverlapped)

{
  long lVar1;
  uint in_EDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  undefined8 *in_R8;
  FAudioIOStream *io;
  
  *in_R8 = 0x103;
  FAudio_PlatformLockMutex((FAudioMutex)0x11c2a1);
  (*(code *)in_RDI[2])(*in_RDI,in_R8[2],0);
  lVar1 = (*(code *)in_RDI[1])(*in_RDI,in_RSI,in_EDX,1);
  in_R8[1] = lVar1 * (ulong)in_EDX;
  FAudio_PlatformUnlockMutex((FAudioMutex)0x11c304);
  *in_R8 = 0;
  return 1;
}

Assistant:

int32_t FACTCALL FACT_INTERNAL_DefaultReadFile(
	void *hFile,
	void *buffer,
	uint32_t nNumberOfBytesToRead,
	uint32_t *lpNumberOfBytesRead, /* Not referenced! */
	FACTOverlapped *lpOverlapped
) {
	FAudioIOStream *io = (FAudioIOStream*) hFile;
	lpOverlapped->Internal = (void*) 0x00000103; /* STATUS_PENDING */
	FAudio_PlatformLockMutex((FAudioMutex) io->lock);
	io->seek(io->data, (size_t) lpOverlapped->Pointer, FAUDIO_SEEK_SET);
	lpOverlapped->InternalHigh = (void*) (size_t) (io->read(
		io->data,
		buffer,
		nNumberOfBytesToRead,
		1
	) * nNumberOfBytesToRead);
	FAudio_PlatformUnlockMutex((FAudioMutex) io->lock);
	lpOverlapped->Internal = 0; /* STATUS_SUCCESS */
	return 1;
}